

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

void vmsa_ttbcr_write(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,uint64_t value)

{
  int iVar1;
  ArchCPU_conflict2 *cpu_00;
  uint64_t *puVar2;
  uint64_t value_00;
  TCR *tcr;
  ARMCPU_conflict1 *cpu;
  uint64_t value_local;
  ARMCPRegInfo_conflict *ri_local;
  CPUARMState_conflict *env_local;
  
  cpu_00 = env_archcpu(env);
  puVar2 = (uint64_t *)raw_ptr(env,ri);
  iVar1 = arm_feature(env,0x1a);
  if (iVar1 != 0) {
    tlb_flush_aarch64(&cpu_00->parent_obj);
  }
  value_00 = deposit64(*puVar2,0,0x20,value);
  vmsa_ttbcr_raw_write(env,ri,value_00);
  return;
}

Assistant:

static void vmsa_ttbcr_write(CPUARMState *env, const ARMCPRegInfo *ri,
                             uint64_t value)
{
    ARMCPU *cpu = env_archcpu(env);
    TCR *tcr = raw_ptr(env, ri);

    if (arm_feature(env, ARM_FEATURE_LPAE)) {
        /* With LPAE the TTBCR could result in a change of ASID
         * via the TTBCR.A1 bit, so do a TLB flush.
         */
        tlb_flush(CPU(cpu));
    }
    /* Preserve the high half of TCR_EL1, set via TTBCR2.  */
    value = deposit64(tcr->raw_tcr, 0, 32, value);
    vmsa_ttbcr_raw_write(env, ri, value);
}